

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O1

int DoSegmentsJob(void *arg1,void *arg2)

{
  int *piVar1;
  float fVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  VP8Histogram *pVVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint32_t dc [16];
  uint8_t tmp [63];
  undefined1 local_c8 [16];
  VP8Histogram local_b8 [11];
  uint8_t auStack_60 [48];
  
  iVar4 = VP8IteratorIsDone((VP8EncIterator *)arg2);
  iVar10 = 1;
  if (iVar4 == 0) {
    do {
      VP8IteratorImport((VP8EncIterator *)arg2,auStack_60);
      lVar9 = *(long *)((long)arg2 + 0x28);
      VP8SetIntra16Mode((VP8EncIterator *)arg2,0);
      VP8SetSkip((VP8EncIterator *)arg2,0);
      VP8SetSegment((VP8EncIterator *)arg2,0);
      if (*(int *)(lVar9 + 0x5c40) < 2) {
        fVar2 = *(float *)(**(long **)((long)arg2 + 0x28) + 4);
        uVar7 = 0xfffffffffffffffc;
        lVar9 = 0;
        pVVar6 = local_b8;
        do {
          (*VP8Mean16x4)((uint8_t *)(*(long *)((long)arg2 + 8) + lVar9),(uint32_t *)pVVar6);
          uVar7 = uVar7 + 4;
          pVVar6 = pVVar6 + 2;
          lVar9 = lVar9 + 0x80;
        } while (uVar7 < 0xc);
        iVar13 = 0;
        iVar14 = 0;
        iVar15 = 0;
        iVar16 = 0;
        lVar9 = 0;
        iVar4 = 0;
        iVar10 = 0;
        iVar11 = 0;
        iVar12 = 0;
        do {
          auVar3 = *(undefined1 (*) [16])(&local_b8[0].max_value + lVar9);
          iVar17 = auVar3._0_4_;
          iVar4 = iVar4 + iVar17;
          iVar18 = auVar3._4_4_;
          iVar10 = iVar10 + iVar18;
          iVar11 = iVar11 + auVar3._8_4_;
          iVar19 = auVar3._12_4_;
          iVar12 = iVar12 + iVar19;
          iVar13 = iVar13 + iVar17 * iVar17;
          iVar14 = iVar14 + iVar18 * iVar18;
          iVar15 = iVar15 + (int)((auVar3._8_8_ & 0xffffffff) * (auVar3._8_8_ & 0xffffffff));
          iVar16 = iVar16 + iVar19 * iVar19;
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x10);
        iVar4 = iVar12 + iVar10 + iVar11 + iVar4;
        if ((uint)((((int)fVar2 * 9) / 100 + 8) * (iVar16 + iVar14 + iVar15 + iVar13)) <
            (uint)(iVar4 * iVar4)) {
          VP8SetIntra16Mode((VP8EncIterator *)arg2,0);
        }
        else {
          local_c8 = (undefined1  [16])0x0;
          VP8SetIntra4Mode((VP8EncIterator *)arg2,local_c8);
        }
        iVar4 = 2;
      }
      else {
        VP8MakeLuma16Preds((VP8EncIterator *)arg2);
        iVar4 = -1;
        uVar8 = 0;
        uVar7 = 0;
        do {
          local_b8[0].max_value = 0;
          local_b8[0].last_non_zero = 1;
          (*VP8CollectHistogram)
                    (*(uint8_t **)((long)arg2 + 8),
                     (uint8_t *)((ulong)VP8I16ModeOffsets[uVar8] + *(long *)((long)arg2 + 0x20)),0,
                     0x10,local_b8);
          iVar10 = 0;
          if (1 < local_b8[0].max_value) {
            iVar10 = (local_b8[0].last_non_zero * 0x1fe) / local_b8[0].max_value;
          }
          if (iVar4 < iVar10) {
            uVar7 = uVar8 & 0xffffffff;
            iVar4 = iVar10;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 == 1);
        VP8SetIntra16Mode((VP8EncIterator *)arg2,(int)uVar7);
        iVar4 = iVar4 * 3 + 2;
      }
      VP8MakeChroma8Preds((VP8EncIterator *)arg2);
      lVar9 = 0;
      iVar10 = -1;
      iVar12 = 0;
      iVar11 = 0;
      do {
        local_b8[0].max_value = 0;
        local_b8[0].last_non_zero = 1;
        (*VP8CollectHistogram)
                  ((uint8_t *)(*(long *)((long)arg2 + 8) + 0x10),
                   (uint8_t *)((ulong)VP8UVModeOffsets[lVar9] + *(long *)((long)arg2 + 0x20)),0x10,
                   0x18,local_b8);
        iVar13 = 0;
        if (1 < local_b8[0].max_value) {
          iVar13 = (local_b8[0].last_non_zero * 0x1fe) / local_b8[0].max_value;
        }
        if (iVar10 < iVar13) {
          iVar10 = iVar13;
        }
        iVar14 = (int)lVar9;
        if (iVar12 <= iVar13 && lVar9 != 0) {
          iVar13 = iVar12;
          iVar14 = iVar11;
        }
        iVar12 = iVar13;
        lVar9 = lVar9 + 1;
        iVar11 = iVar14;
      } while (lVar9 == 1);
      VP8SetIntraUVMode((VP8EncIterator *)arg2,iVar14);
      uVar5 = 0xff - (iVar4 + iVar10 >> 2);
      if (0xfe < (int)uVar5) {
        uVar5 = 0xff;
      }
      uVar7 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar7 = 0;
      }
      piVar1 = (int *)((long)arg1 + uVar7 * 4 + 0x30);
      *piVar1 = *piVar1 + 1;
      *(char *)(*(long *)((long)arg2 + 0x30) + 1) = (char)uVar7;
      *(int *)((long)arg1 + 0x430) = *(int *)((long)arg1 + 0x430) + (int)uVar7;
      *(int *)((long)arg1 + 0x434) = *(int *)((long)arg1 + 0x434) + iVar10;
      iVar10 = VP8IteratorProgress((VP8EncIterator *)arg2,*(int *)((long)arg1 + 0x1340));
    } while ((iVar10 != 0) && (iVar4 = VP8IteratorNext((VP8EncIterator *)arg2), iVar4 != 0));
  }
  return iVar10;
}

Assistant:

static int DoSegmentsJob(void* arg1, void* arg2) {
  SegmentJob* const job = (SegmentJob*)arg1;
  VP8EncIterator* const it = (VP8EncIterator*)arg2;
  int ok = 1;
  if (!VP8IteratorIsDone(it)) {
    uint8_t tmp[32 + WEBP_ALIGN_CST];
    uint8_t* const scratch = (uint8_t*)WEBP_ALIGN(tmp);
    do {
      // Let's pretend we have perfect lossless reconstruction.
      VP8IteratorImport(it, scratch);
      MBAnalyze(it, job->alphas, &job->alpha, &job->uv_alpha);
      ok = VP8IteratorProgress(it, job->delta_progress);
    } while (ok && VP8IteratorNext(it));
  }
  return ok;
}